

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

void nn_btcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_list *self_00;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_atcp *atcp;
  nn_btcp *btcp;
  nn_list_item *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  nn_list_item *in_stack_ffffffffffffffa8;
  long local_30;
  
  local_30 = in_RDI;
  if (in_RDI == 0) {
    local_30 = 0;
  }
  if (*(int *)(local_30 + 0x80) == 1) {
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_FSM_ACTION",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
              ,0x10b);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_FSM_START",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
              ,0x10c);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(local_30 + 0x80) = 2;
  }
  else {
    if (*(int *)(local_30 + 0x80) != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_30 + 0x80),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
              ,0x13c);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI == 3) {
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_BTCP_TYPE_LISTEN_ERR",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
                ,0x116);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_free((void *)0x150d7a);
    }
    else if (in_ESI == 1) {
      if (in_EDX != 8 && in_EDX != 7) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
                ,0x11d);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (in_ESI != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_BTCP_SRC_ATCP",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
                ,0x122);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX == 0x85b7) {
        if (*(long *)(local_30 + 0x2f0) != in_RCX) {
          nn_backtrace_print();
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","btcp->atcp == atcp",
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
                  ,0x126);
          fflush(_stderr);
          nn_err_abort();
        }
        self_00 = (nn_list *)(local_30 + 0x2f8);
        nn_list_end((nn_list *)(local_30 + 0x2f8));
        nn_list_insert(self_00,in_stack_ffffffffffffffa8,
                       (nn_list_item *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                      );
        *(undefined8 *)(local_30 + 0x2f0) = 0;
        nn_btcp_start_accepting((nn_btcp *)0x150f69);
      }
      else if (in_EDX == 0x85b8) {
        nn_atcp_stop((nn_atcp *)0x150f78);
      }
      else {
        if (in_EDX != 0x85b9) {
          nn_backtrace_print();
          fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                  (ulong)*(uint *)(local_30 + 0x80),2,(ulong)in_EDX,
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
                  ,0x135);
          fflush(_stderr);
          nn_err_abort();
        }
        nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
        nn_atcp_term((nn_atcp *)0x150fa4);
        nn_free((void *)0x150fae);
      }
    }
  }
  return;
}

Assistant:

static void nn_btcp_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    switch (btcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BTCP_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        btcp->state = NN_BTCP_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the atcp state machine in this state.         */
/******************************************************************************/
    case NN_BTCP_STATE_ACTIVE:
        if (src == NN_BTCP_SRC_BTCP) {   
            nn_assert (type == NN_BTCP_TYPE_LISTEN_ERR);
            nn_free (btcp);
            return;
        }

        if (src == NN_BTCP_SRC_USOCK) {
            /*  usock object cleaning up */
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /*  All other events come from child atcp objects. */
        nn_assert (src == NN_BTCP_SRC_ATCP);
        atcp = (struct nn_atcp*) srcptr;
        switch (type) {
        case NN_ATCP_ACCEPTED:
            nn_assert (btcp->atcp == atcp) ;
            nn_list_insert (&btcp->atcps, &atcp->item,
                nn_list_end (&btcp->atcps));
            btcp->atcp = NULL;
            nn_btcp_start_accepting (btcp);
            return;
        case NN_ATCP_ERROR:
            nn_atcp_stop (atcp);
            return;
        case NN_ATCP_STOPPED:
            nn_list_erase (&btcp->atcps, &atcp->item);
            nn_atcp_term (atcp);
            nn_free (atcp);
            return;
        default:
            nn_fsm_bad_action (btcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (btcp->state, src, type);
    }
}